

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O0

bool __thiscall PsxRelocator::parseObject(PsxRelocator *this,ByteArray *data,PsxRelocatorFile *dest)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *this_00;
  vector<PsxSymbol,_std::allocator<PsxSymbol>_> *this_01;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *pvVar4;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *pvVar5;
  size_type sVar6;
  reference pvVar7;
  byte *pbVar8;
  undefined1 *puVar9;
  undefined1 *pos_00;
  size_t sVar10;
  undefined1 local_298 [8];
  PsxSymbol sym_4;
  PsxSymbol sym_3;
  PsxSymbol sym_2;
  PsxSymbol sym_1;
  PsxSymbol sym;
  undefined1 local_128 [4];
  int otherType;
  PsxRelocation rel;
  int type;
  ByteArray d_1;
  undefined1 local_e8 [4];
  int size_1;
  ByteArray d;
  ulong uStack_c8;
  int size;
  size_t i;
  int num;
  int id;
  string *name;
  undefined1 local_a0 [8];
  PsxSegment seg;
  int lastSegmentPartStart;
  int activeSegment;
  vector<PsxSymbol,_std::allocator<PsxSymbol>_> *syms;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *segments;
  size_t pos;
  PsxRelocatorFile *dest_local;
  ByteArray *data_local;
  PsxRelocator *this_local;
  
  pbVar3 = ByteArray::data(data,0);
  iVar2 = memcmp(pbVar3,"LNK\x02.\a",6);
  if (iVar2 != 0) {
    this_local._7_1_ = 0;
LAB_001d5d71:
    return (bool)(this_local._7_1_ & 1);
  }
  segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)0x6;
  this_00 = &dest->segments;
  this_01 = &dest->symbols;
  seg.relocations.super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  seg.relocations.super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = -1;
LAB_001d5073:
  pvVar5 = segments;
  pvVar4 = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)ByteArray::size(data);
  if (pvVar4 <= segments) {
    this_local._7_1_ = 1;
    goto LAB_001d5d71;
  }
  pbVar3 = ByteArray::operator[](data,(size_t)segments);
  switch(*pbVar3) {
  case '\0':
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
    goto LAB_001d5073;
  default:
    this_local._7_1_ = 0;
    goto LAB_001d5d71;
  case '\x02':
    d.allocatedSize_._4_4_ =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    puVar9 = (undefined1 *)
             ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl
                     .super__Vector_impl_data._M_start + 3);
    ByteArray::mid((ByteArray *)local_e8,data,(size_t)puVar9,(long)d.allocatedSize_._4_4_);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)(puVar9 + d.allocatedSize_._4_4_);
    pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[]
                       (this_00,(long)seg.relocations.
                                      super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    sVar10 = ByteArray::size(&pvVar7->data);
    seg.relocations.super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar10;
    pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[]
                       (this_00,(long)seg.relocations.
                                      super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ByteArray::append(&pvVar7->data,(ByteArray *)local_e8);
    ByteArray::~ByteArray((ByteArray *)local_e8);
    goto LAB_001d5073;
  case '\x06':
    iVar2 = ByteArray::getWord(data,(size_t)((long)&(segments->
                                                                                                        
                                                  super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1),
                               Little);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 3);
    i._0_4_ = -1;
    for (uStack_c8 = 0; sVar6 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::size(this_00),
        uStack_c8 < sVar6; uStack_c8 = uStack_c8 + 1) {
      pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[](this_00,uStack_c8);
      if (pvVar7->id == iVar2) {
        i._0_4_ = (int)uStack_c8;
        break;
      }
    }
    seg.relocations.super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (int)i;
    goto LAB_001d5073;
  case '\b':
    iVar2 = ByteArray::getWord(data,(size_t)((long)&(segments->
                                                                                                        
                                                  super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1),
                               Little);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 3);
    ByteArray::ByteArray((ByteArray *)&rel.filePos);
    ByteArray::reserveBytes((ByteArray *)&rel.filePos,(long)iVar2,'\0');
    pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[]
                       (this_00,(long)seg.relocations.
                                      super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ByteArray::append(&pvVar7->data,(ByteArray *)&rel.filePos);
    ByteArray::~ByteArray((ByteArray *)&rel.filePos);
    goto LAB_001d5073;
  case '\n':
    pbVar8 = ByteArray::operator[]
                       (data,(size_t)((long)&(segments->
                                             super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
    rel.relativeOffset = (int)*pbVar8;
    puVar9 = (undefined1 *)
             ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl
                     .super__Vector_impl_data._M_start + 2);
    PsxRelocation::PsxRelocation((PsxRelocation *)local_128);
    rel.referenceId = 0;
    segments._0_4_ = (int)puVar9;
    rel.referencePos = (int)segments + -2;
    if (rel.relativeOffset == 0x10) {
      local_128 = (undefined1  [4])0x0;
      rel.type = ByteArray::getWord(data,(size_t)puVar9,Little);
    }
    else if (rel.relativeOffset == 0x4a) {
      local_128 = (undefined1  [4])0x3;
      rel.type = ByteArray::getWord(data,(size_t)puVar9,Little);
    }
    else if (rel.relativeOffset == 0x52) {
      local_128 = (undefined1  [4])0x1;
      rel.type = ByteArray::getWord(data,(size_t)puVar9,Little);
    }
    else {
      if (rel.relativeOffset != 0x54) {
        this_local._7_1_ = 0;
        goto LAB_001d5d71;
      }
      local_128 = (undefined1  [4])0x2;
      rel.type = ByteArray::getWord(data,(size_t)puVar9,Little);
    }
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(pvVar5->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl
                       .super__Vector_impl_data._M_start + 4);
    rel.type = (int)seg.relocations.
                    super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + rel.type;
    while( true ) {
      puVar9 = (undefined1 *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
      pbVar8 = ByteArray::operator[](data,(size_t)segments);
      sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           (uint)*pbVar8;
      if (sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ ==
          2) break;
      if (sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ ==
          0x2c) {
        otherType = 1;
        pos_00 = (undefined1 *)
                 ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                         _M_impl.super__Vector_impl_data._M_start + 2);
        pbVar3 = ByteArray::operator[](data,(size_t)puVar9);
        if (*pbVar3 != '\0') {
          if (*pbVar3 != '\x04') {
            this_local._7_1_ = 0;
            goto LAB_001d5d71;
          }
          rel.refType = ByteArray::getWord(data,(size_t)pos_00,Little);
          pbVar3 = ByteArray::operator[]
                             (data,(size_t)((long)&(segments->
                                                                                                      
                                                  super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 4));
          if (*pbVar3 != '\0') {
            this_local._7_1_ = 0;
            goto LAB_001d5d71;
          }
          rel.segmentOffset =
               ByteArray::getDoubleWord
                         (data,(size_t)((long)&(segments->
                                               super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 5),
                          Little);
          segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
                     ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                             ._M_impl.super__Vector_impl_data._M_finish + 1);
          goto LAB_001d580c;
        }
        rel.referenceId = ByteArray::getDoubleWord(data,(size_t)pos_00,Little);
        segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
                   ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                           _M_impl.super__Vector_impl_data._M_start + 6);
      }
      else {
        if (sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
            != 0x2e) {
          this_local._7_1_ = 0;
          goto LAB_001d5d71;
        }
        otherType = 1;
        pbVar3 = ByteArray::operator[](data,(size_t)puVar9);
        if (*pbVar3 != '\0') {
          this_local._7_1_ = 0;
          goto LAB_001d5d71;
        }
        iVar2 = ByteArray::getDoubleWord
                          (data,(size_t)((long)&(segments->
                                                super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                )._M_impl.super__Vector_impl_data._M_start + 2),
                           Little);
        rel.referenceId = -iVar2;
        segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
                   ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                           _M_impl.super__Vector_impl_data._M_start + 6);
      }
    }
    otherType = 0;
    rel.refType = ByteArray::getWord(data,(size_t)puVar9,Little);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 3);
LAB_001d580c:
    pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[]
                       (this_00,(long)seg.relocations.
                                      super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>::push_back
              (&pvVar7->relocations,(value_type *)local_128);
    goto LAB_001d5073;
  case '\f':
    PsxSymbol::PsxSymbol
              ((PsxSymbol *)
               &sym_4.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sym_4.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    sym_3.segment =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    sym_3.name.field_2._8_4_ =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 3),
                            Little);
    sym_3.name.field_2._12_4_ =
         ByteArray::getDoubleWord
                   (data,(size_t)((long)&(segments->
                                         super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 5),Little);
    sVar10 = loadString(this,data,
                        (size_t)((long)&(segments->
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                                        ._M_impl.super__Vector_impl_data._M_finish + 1),
                        (string *)&sym_3);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_finish + sVar10 + 1);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back
              (this_01,(value_type *)
                       &sym_4.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    PsxSymbol::~PsxSymbol
              ((PsxSymbol *)
               &sym_4.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_001d5073;
  case '\x0e':
    PsxSymbol::PsxSymbol
              ((PsxSymbol *)
               &sym_2.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sym_2.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
    sym_1.segment =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    sVar10 = loadString(this,data,
                        (size_t)((long)&(segments->
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + 3),
                        (string *)&sym_1);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar10 + 3);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back
              (this_01,(value_type *)
                       &sym_2.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    PsxSymbol::~PsxSymbol
              ((PsxSymbol *)
               &sym_2.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_001d5073;
  case '\x10':
    break;
  case '\x12':
    PsxSymbol::PsxSymbol
              ((PsxSymbol *)
               &sym_1.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sym_1.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
    sym.name.field_2._8_4_ =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    sym.name.field_2._12_4_ =
         ByteArray::getDoubleWord
                   (data,(size_t)((long)&(segments->
                                         super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 3),Little);
    sVar10 = loadString(this,data,
                        (size_t)((long)&(segments->
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + 7),
                        (string *)&sym);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar10 + 7);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back
              (this_01,(value_type *)
                       &sym_1.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    PsxSymbol::~PsxSymbol
              ((PsxSymbol *)
               &sym_1.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_001d5073;
  case '\x14':
    pbVar8 = ByteArray::operator[]
                       (data,(size_t)((long)&(segments->
                                             super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 4));
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + (long)(int)(*pbVar8 + 5));
    goto LAB_001d5073;
  case '\x1c':
    pbVar8 = ByteArray::operator[]
                       (data,(size_t)((long)&(segments->
                                             super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 3));
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + (long)(int)(*pbVar8 + 4));
    goto LAB_001d5073;
  case '0':
    PsxSymbol::PsxSymbol
              ((PsxSymbol *)
               &sym_3.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sym_3.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 3;
    sym_2.segment =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    sym_2.name.field_2._8_4_ =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 3),
                            Little);
    sym_2.offset = ByteArray::getDoubleWord
                             (data,(size_t)((long)&(segments->
                                                                                                      
                                                  super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 5),
                              Little);
    sVar10 = loadString(this,data,
                        (size_t)((long)&(segments->
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                                        ._M_impl.super__Vector_impl_data._M_finish + 1),
                        (string *)&sym_2);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_finish + sVar10 + 1);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back
              (this_01,(value_type *)
                       &sym_3.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    PsxSymbol::~PsxSymbol
              ((PsxSymbol *)
               &sym_3.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_001d5073;
  case '2':
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 3);
    goto LAB_001d5073;
  case ':':
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_finish + 1);
    goto LAB_001d5073;
  case '<':
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start + 3);
    goto LAB_001d5073;
  case 'J':
    PsxSymbol::PsxSymbol((PsxSymbol *)local_298);
    local_298._0_4_ = Function;
    sym_4.name.field_2._8_4_ =
         ByteArray::getWord(data,(size_t)((long)&(segments->
                                                 super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1),
                            Little);
    sym_4.name.field_2._12_4_ =
         ByteArray::getDoubleWord
                   (data,(size_t)((long)&(segments->
                                         super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 3),Little);
    sVar10 = loadString(this,data,
                        (size_t)((long)&segments[1].
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                                        _M_impl.super__Vector_impl_data._M_start + 5),
                        (string *)&sym_4);
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&segments[1].super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar10 + 5);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,(value_type *)local_298);
    PsxSymbol::~PsxSymbol((PsxSymbol *)local_298);
    goto LAB_001d5073;
  case 'L':
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_finish + 3);
    goto LAB_001d5073;
  }
  PsxSegment::PsxSegment((PsxSegment *)local_a0);
  seg.name.field_2._8_4_ =
       ByteArray::getDoubleWord
                 (data,(size_t)((long)&(segments->
                                       super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                                       _M_impl.super__Vector_impl_data._M_start + 1),Little);
  std::vector<PsxSegment,_std::allocator<PsxSegment>_>::push_back(this_00,(value_type *)local_a0);
  pvVar5 = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
           ((long)&(segments->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl.
                   super__Vector_impl_data._M_start + 5);
  pbVar3 = ByteArray::operator[](data,(size_t)pvVar5);
  bVar1 = *pbVar3;
  if (bVar1 == '\b') {
    sVar6 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::size(this_00);
    pvVar7 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::operator[](this_00,sVar6 - 1);
    sVar10 = loadString(this,data,
                        (size_t)((long)&(segments->
                                        super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + 6),&pvVar7->name
                       );
    segments = (vector<PsxSegment,_std::allocator<PsxSegment>_> *)
               ((long)&(pvVar5->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl
                       .super__Vector_impl_data._M_start + sVar10 + 1);
  }
  else {
    this_local._7_1_ = 0;
    segments = pvVar5;
  }
  PsxSegment::~PsxSegment((PsxSegment *)local_a0);
  if (bVar1 != '\b') goto LAB_001d5d71;
  goto LAB_001d5073;
}

Assistant:

bool PsxRelocator::parseObject(ByteArray data, PsxRelocatorFile& dest)
{
	if (memcmp(data.data(),psxObjectFileMagicNum,sizeof(psxObjectFileMagicNum)) != 0)
		return false;

	size_t pos = 6;

	std::vector<PsxSegment>& segments = dest.segments;
	std::vector<PsxSymbol>& syms = dest.symbols;

	int activeSegment = -1;
	int lastSegmentPartStart = -1;
	while (pos < data.size())
	{
		switch (data[pos])
		{
		case 0x10:	// segment definition
			{
				PsxSegment seg;
				seg.id = data.getDoubleWord(pos+1);
				segments.push_back(seg);
				pos += 5;

				if (data[pos] != 8)
					return false;

				std::string& name = segments[segments.size()-1].name;
				pos += 1 + loadString(data,pos+1,name);
			}
			break;
		case 0x14:	// group?
			pos += data[pos+4]+5;
			break;
		case 0x1C:	// source file name
			pos += data[pos+3]+4;
			break;

		case 0x06:	// set segment id
			{
				int id = data.getWord(pos+1);
				pos += 3;
				
				int num = -1;
				for (size_t i = 0; i < segments.size(); i++)
					{
					if (segments[i].id == id)
					{
						num = (int) i;
						break;
					}
				}

				activeSegment = num;
			}
			break;
		case 0x02:	// append to data segment
			{
				int size = data.getWord(pos+1);
				pos += 3;

				ByteArray d = data.mid(pos,size);
				pos += size;

				lastSegmentPartStart = (int) segments[activeSegment].data.size();
				segments[activeSegment].data.append(d);
			}
			break;
		case 0x08:	// append zeroes data segment
			{
				int size = data.getWord(pos+1);
				pos += 3;

				ByteArray d;
				d.reserveBytes(size);
				segments[activeSegment].data.append(d);
			}
			break;
		case 0x0A:	// relocation data
			{
				int type = data[pos+1];
				pos += 2;

				PsxRelocation rel;
				rel.relativeOffset = 0;
				rel.filePos = (int) pos-2;

				switch (type)
				{
				case 0x10:	// 32 bit word
					rel.type = PsxRelocationType::WordLiteral;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x4A:	// jal
					rel.type = PsxRelocationType::FunctionCall;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x52:	// upper immerdiate
					rel.type = PsxRelocationType::UpperImmediate;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x54:	// lower immediate (add)
					rel.type = PsxRelocationType::LowerImmediate;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				default:
					return false;
				}

				rel.segmentOffset += lastSegmentPartStart;
checkothertype:
				int otherType = data[pos++];
				switch (otherType)
				{
				case 0x02:	// reference to symbol with id num
					rel.refType = PsxRelocationRefType::SymblId;
					rel.referenceId = data.getWord(pos);
					pos += 2;
					break;
				case 0x2C:	// ref to other segment?
					rel.refType = PsxRelocationRefType::SegmentOffset;

					switch (data[pos++])
					{
					case 0x00:
						rel.relativeOffset = data.getDoubleWord(pos);
						pos += 4;
						goto checkothertype;
					case 0x04:					
						rel.referenceId = data.getWord(pos);	// segment id
						pos += 2;
					
						if (data[pos++] != 0x00)
						{
							return false;
						}

						rel.referencePos = data.getDoubleWord(pos);
						pos += 4;
						break;
					default:
						return false;
					}
					break;
				case 0x2E:	// negative ref?
					rel.refType = PsxRelocationRefType::SegmentOffset;

					switch (data[pos++])
					{
					case 0x00:
						rel.relativeOffset = -data.getDoubleWord(pos);
						pos += 4;
						goto checkothertype;
					default:
						return false;
					}
					break;
				default:
					return false;
				}

				segments[activeSegment].relocations.push_back(rel);
			}
			break;
		case 0x12:	// internal symbol
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::Internal;
				sym.segment = data.getWord(pos+1);
				sym.offset = data.getDoubleWord(pos+3);
				pos += 7 + loadString(data,pos+7,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x0E:	// external symbol
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::External;
				sym.id = data.getWord(pos+1);
				pos += 3 + loadString(data,pos+3,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x30:	// bss symbol?
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::BSS;
				sym.id = data.getWord(pos+1);
				sym.segment = data.getWord(pos+3);
				sym.size = data.getDoubleWord(pos+5);
				pos += 9 + loadString(data,pos+9,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x0C:	// internal with id
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::InternalID;
				sym.id = data.getWord(pos+1);
				sym.segment = data.getWord(pos+3);
				sym.offset = data.getDoubleWord(pos+5);
				pos += 9 + loadString(data,pos+9,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x4A:	// function
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::Function;
				sym.segment = data.getWord(pos+1);
				sym.offset = data.getDoubleWord(pos+3);
				pos += 0x1D + loadString(data,pos+0x1D,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x4C:	// function size
			pos += 11;
			break;
		case 0x3C:	// ??
			pos += 3;
			break;
		case 0x00:	// ??
			pos++;
			break;
		case 0x32:	// ??
			pos += 3;
			break;
		case 0x3A:	// ??
			pos += 9;
			break;
		default:
			return false;
		}
	}

	return true;
}